

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeUpdateNextOpen(ImGuiID id,ImGuiTreeNodeFlags flags)

{
  int iVar1;
  uint in_ESI;
  byte bVar2;
  int stored_value;
  bool is_open;
  ImGuiStorage *storage;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  ImGuiID key;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool local_1;
  
  if ((in_ESI & 0x100) == 0) {
    pIVar4 = GImGui->CurrentWindow;
    key = (ImGuiID)((ulong)pIVar4 >> 0x20);
    pIVar5 = GImGui;
    if (((GImGui->NextItemData).Flags & 2U) == 0) {
      iVar1 = ImGuiStorage::GetInt((ImGuiStorage *)GImGui,key,(int)pIVar4);
      bVar2 = iVar1 != 0;
    }
    else if (((GImGui->NextItemData).OpenCond & 1U) == 0) {
      iVar1 = ImGuiStorage::GetInt((ImGuiStorage *)GImGui,key,(int)pIVar4);
      if (iVar1 == -1) {
        uVar3 = CONCAT13((pIVar5->NextItemData).OpenVal,(int3)in_stack_ffffffffffffffd4) & 0x1ffffff
        ;
        TreeNodeSetOpen(uVar3,true);
        bVar2 = (byte)(uVar3 >> 0x18);
      }
      else {
        bVar2 = iVar1 != 0;
      }
    }
    else {
      uVar3 = CONCAT13((GImGui->NextItemData).OpenVal,(int3)in_stack_ffffffffffffffd4) & 0x1ffffff;
      TreeNodeSetOpen(uVar3,SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0));
      bVar2 = (byte)(uVar3 >> 0x18);
    }
    if ((((pIVar5->LogEnabled & 1U) != 0) && ((in_ESI & 0x10) == 0)) &&
       ((pIVar4->DC).TreeDepth - pIVar5->LogDepthRef < pIVar5->LogDepthToExpand)) {
      bVar2 = 1;
    }
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeUpdateNextOpen(ImGuiID id, ImGuiTreeNodeFlags flags)
{
    if (flags & ImGuiTreeNodeFlags_Leaf)
        return true;

    // We only write to the tree storage if the user clicks (or explicitly use the SetNextItemOpen function)
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStorage* storage = window->DC.StateStorage;

    bool is_open;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasOpen)
    {
        if (g.NextItemData.OpenCond & ImGuiCond_Always)
        {
            is_open = g.NextItemData.OpenVal;
            TreeNodeSetOpen(id, is_open);
        }
        else
        {
            // We treat ImGuiCond_Once and ImGuiCond_FirstUseEver the same because tree node state are not saved persistently.
            const int stored_value = storage->GetInt(id, -1);
            if (stored_value == -1)
            {
                is_open = g.NextItemData.OpenVal;
                TreeNodeSetOpen(id, is_open);
            }
            else
            {
                is_open = stored_value != 0;
            }
        }
    }
    else
    {
        is_open = storage->GetInt(id, (flags & ImGuiTreeNodeFlags_DefaultOpen) ? 1 : 0) != 0;
    }

    // When logging is enabled, we automatically expand tree nodes (but *NOT* collapsing headers.. seems like sensible behavior).
    // NB- If we are above max depth we still allow manually opened nodes to be logged.
    if (g.LogEnabled && !(flags & ImGuiTreeNodeFlags_NoAutoOpenOnLog) && (window->DC.TreeDepth - g.LogDepthRef) < g.LogDepthToExpand)
        is_open = true;

    return is_open;
}